

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_differencer.cc
# Opt level: O2

bool __thiscall
google::protobuf::util::MessageDifferencer::Compare
          (MessageDifferencer *this,Message *message1,Message *message2,int unpacked_any,
          vector<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
          *parent_fields)

{
  pointer message1_00;
  bool bVar1;
  byte bVar2;
  bool bVar3;
  UnknownFieldSet *unknown_field_set1;
  UnknownFieldSet *unknown_field_set2;
  pointer message2_00;
  Descriptor *unaff_RBP;
  Metadata MVar4;
  Metadata MVar5;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  message2_fields;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  message1_fields;
  
  bVar2 = (byte)unaff_RBP;
  MVar4 = Message::GetMetadata(message1);
  bVar1 = std::operator==((MVar4.descriptor)->all_names_ + 1,"google.protobuf.Any");
  if (bVar1) {
    message1_fields.
    super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    message2_fields.
    super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    bVar1 = UnpackAnyField::UnpackAny
                      (&this->unpack_any_field_,message1,
                       (unique_ptr<google::protobuf::Message,_std::default_delete<google::protobuf::Message>_>
                        *)&message1_fields);
    if (bVar1) {
      bVar1 = UnpackAnyField::UnpackAny
                        (&this->unpack_any_field_,message2,
                         (unique_ptr<google::protobuf::Message,_std::default_delete<google::protobuf::Message>_>
                          *)&message2_fields);
      message1_00 = message1_fields.
                    super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                    ._M_impl.super__Vector_impl_data._M_start;
      message2_00 = message2_fields.
                    super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                    ._M_impl.super__Vector_impl_data._M_start;
      if (bVar1) {
        MVar4 = Message::GetMetadata
                          ((Message *)
                           message1_fields.
                           super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                           ._M_impl.super__Vector_impl_data._M_start);
        message2_00 = message2_fields.
                      super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                      ._M_impl.super__Vector_impl_data._M_start;
        unaff_RBP = MVar4.descriptor;
        MVar4 = Message::GetMetadata
                          ((Message *)
                           message2_fields.
                           super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                           ._M_impl.super__Vector_impl_data._M_start);
        if (unaff_RBP != MVar4.descriptor) goto LAB_002da8d4;
        bVar2 = Compare(this,(Message *)message1_00,(Message *)message2_00,unpacked_any + 1,
                        parent_fields);
        bVar1 = true;
      }
      else {
LAB_002da8d4:
        bVar2 = (byte)unaff_RBP;
        bVar1 = false;
      }
      if (message2_00 != (pointer)0x0) {
        (*(code *)(*message2_00)->all_names_)(message2_00);
      }
    }
    else {
      bVar1 = false;
    }
    if (message1_fields.
        super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      (*(code *)(*message1_fields.
                  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                  ._M_impl.super__Vector_impl_data._M_start)->all_names_)();
    }
    if (bVar1) goto LAB_002da9ce;
  }
  bVar1 = true;
  if (this->message_field_comparison_ != EQUIVALENT) {
    MVar4 = Message::GetMetadata(message1);
    MVar5 = Message::GetMetadata(message2);
    unknown_field_set1 = Reflection::GetUnknownFields(MVar4.reflection,message1);
    unknown_field_set2 = Reflection::GetUnknownFields(MVar5.reflection,message2);
    bVar1 = CompareUnknownFields
                      (this,message1,message2,unknown_field_set1,unknown_field_set2,parent_fields);
    if ((!bVar1) && (this->reporter_ == (Reporter *)0x0)) {
      bVar2 = 0;
      goto LAB_002da9ce;
    }
  }
  RetrieveFields(&message1_fields,this,message1,true);
  RetrieveFields(&message2_fields,this,message2,false);
  bVar3 = CompareRequestedFieldsUsingSettings
                    (this,message1,message2,unpacked_any,&message1_fields,&message2_fields,
                     parent_fields);
  bVar2 = bVar1 & bVar3;
  std::
  _Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ::~_Vector_base(&message2_fields.
                   super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                 );
  std::
  _Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ::~_Vector_base(&message1_fields.
                   super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                 );
LAB_002da9ce:
  return (bool)(bVar2 & 1);
}

Assistant:

bool MessageDifferencer::Compare(const Message& message1,
                                 const Message& message2, int unpacked_any,
                                 std::vector<SpecificField>* parent_fields) {
  // Expand google.protobuf.Any payload if possible.
  if (message1.GetDescriptor()->full_name() == internal::kAnyFullTypeName) {
    std::unique_ptr<Message> data1;
    std::unique_ptr<Message> data2;
    if (unpack_any_field_.UnpackAny(message1, &data1) &&
        unpack_any_field_.UnpackAny(message2, &data2) &&
        data1->GetDescriptor() == data2->GetDescriptor()) {
      return Compare(*data1, *data2, unpacked_any + 1, parent_fields);
    }
    // If the Any payload is unparsable, or the payload types are different
    // between message1 and message2, fall through and treat Any as a regular
    // proto.
  }

  bool unknown_compare_result = true;
  // Ignore unknown fields in EQUIVALENT mode
  if (message_field_comparison_ != EQUIVALENT) {
    const Reflection* reflection1 = message1.GetReflection();
    const Reflection* reflection2 = message2.GetReflection();
    const UnknownFieldSet& unknown_field_set1 =
        reflection1->GetUnknownFields(message1);
    const UnknownFieldSet& unknown_field_set2 =
        reflection2->GetUnknownFields(message2);
    if (!CompareUnknownFields(message1, message2, unknown_field_set1,
                              unknown_field_set2, parent_fields)) {
      if (reporter_ == NULL) {
        return false;
      }
      unknown_compare_result = false;
    }
  }

  std::vector<const FieldDescriptor*> message1_fields =
      RetrieveFields(message1, true);
  std::vector<const FieldDescriptor*> message2_fields =
      RetrieveFields(message2, false);

  return CompareRequestedFieldsUsingSettings(message1, message2, unpacked_any,
                                             message1_fields, message2_fields,
                                             parent_fields) &&
         unknown_compare_result;
}